

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void ctor_suite::construct_map_key_string(void)

{
  int iVar1;
  size_type sVar2;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_00;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_01;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_02;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_a60;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_a48;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_a30;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_a18;
  basic_variable<std::allocator<char>_> *local_a00;
  basic_variable<std::allocator<char>_> *local_9e8;
  basic_variable<std::allocator<char>_> *local_9d0;
  basic_variable<std::allocator<char>_> *local_9b8;
  basic_variable<std::allocator<char>_> *local_9a0;
  basic_variable<std::allocator<char>_> *local_988;
  basic_variable<std::allocator<char>_> *local_970;
  basic_variable<std::allocator<char>_> *local_958;
  undefined1 local_94b;
  undefined1 local_94a [2];
  undefined1 local_948 [8];
  variable data_15;
  undefined1 local_90b;
  undefined1 local_90a [2];
  undefined1 local_908 [8];
  variable data_14;
  undefined1 local_8cb;
  undefined1 local_8ca [2];
  undefined1 local_8c8 [8];
  variable data_13;
  undefined1 local_88b;
  undefined1 local_88a [2];
  undefined1 local_888 [8];
  variable data_12;
  undefined1 local_84c;
  undefined1 local_84b [2];
  allocator<char32_t> local_849;
  u32string local_848 [32];
  undefined1 local_828 [8];
  variable data_11;
  undefined1 local_7ec;
  undefined1 local_7eb [2];
  allocator<char16_t> local_7e9;
  u16string local_7e8 [32];
  undefined1 local_7c8 [8];
  variable data_10;
  undefined1 local_78c;
  undefined1 local_78b [2];
  allocator<wchar_t> local_789;
  wstring local_788 [32];
  undefined1 local_768 [8];
  variable data_9;
  undefined1 local_72c;
  undefined1 local_72b [2];
  allocator<char> local_729;
  string local_728 [32];
  undefined1 local_708 [8];
  variable data_8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_6c8;
  undefined1 local_668 [16];
  undefined1 local_658 [8];
  variable data_7;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_618;
  undefined1 local_5b8 [16];
  undefined1 local_5a8 [8];
  variable data_6;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_568;
  undefined1 local_508 [16];
  undefined1 local_4f8 [8];
  variable data_5;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_4b8;
  undefined1 local_458 [16];
  undefined1 local_448 [8];
  variable data_4;
  basic_variable<std::allocator<char>_> local_408;
  basic_variable<std::allocator<char>_> local_3d8;
  undefined1 auStack_3a8 [32];
  basic_variable<std::allocator<char>_> local_388;
  undefined1 local_358 [16];
  undefined1 local_348 [8];
  variable data_3;
  basic_variable<std::allocator<char>_> local_308;
  basic_variable<std::allocator<char>_> local_2d8;
  undefined1 auStack_2a8 [32];
  basic_variable<std::allocator<char>_> local_288;
  undefined1 local_258 [16];
  undefined1 local_248 [8];
  variable data_2;
  basic_variable<std::allocator<char>_> local_208;
  basic_variable<std::allocator<char>_> local_1d8;
  undefined1 auStack_1a8 [32];
  basic_variable<std::allocator<char>_> local_188;
  undefined1 local_158 [16];
  undefined1 local_148 [8];
  variable data_1;
  undefined1 local_110;
  undefined1 local_10f [2];
  undefined1 local_10d;
  basic_variable<std::allocator<char>_> *local_100;
  basic_variable<std::allocator<char>_> local_f8;
  basic_variable<std::allocator<char>_> local_c8;
  undefined1 auStack_98 [32];
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [16];
  undefined1 local_38 [8];
  variable data;
  
  local_10d = 1;
  auStack_98._24_8_ = &local_78;
  local_100 = &local_f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_100,"alpha");
  local_100 = &local_c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_100,1);
  auStack_98._8_8_ = &local_f8;
  auStack_98._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_78,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_98 + 8));
  local_10d = 0;
  local_48._0_8_ = &local_78;
  local_48._8_8_ = 1;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_48);
  local_958 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_958 = local_958 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_958);
  } while (local_958 != &local_78);
  local_970 = (basic_variable<std::allocator<char>_> *)auStack_98;
  do {
    local_970 = local_970 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_970);
  } while (local_970 != &local_f8);
  local_10f[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                 is<trial::dynamic::basic_map<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>> *)local_38);
  local_110 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<map>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x117,"void ctor_suite::construct_map_key_string()",local_10f,&local_110);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  data_2.storage._47_1_ = 1;
  auStack_1a8._24_8_ = &local_188;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_208,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_1d8,1);
  auStack_1a8._8_8_ = &local_208;
  auStack_1a8._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_188,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_1a8 + 8));
  data_2.storage._47_1_ = 0;
  local_158._0_8_ = &local_188;
  local_158._8_8_ = 1;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_148,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_158);
  local_988 = (basic_variable<std::allocator<char>_> *)local_158;
  do {
    local_988 = local_988 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_988);
  } while (local_988 != &local_188);
  local_9a0 = (basic_variable<std::allocator<char>_> *)auStack_1a8;
  do {
    local_9a0 = local_9a0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_9a0);
  } while (local_9a0 != &local_208);
  data_2.storage._45_1_ =
       trial::dynamic::basic_variable<std::allocator<char>>::
       is<trial::dynamic::basic_map<std::allocator<char>>>
                 ((basic_variable<std::allocator<char>> *)local_148);
  data_2.storage._44_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<map>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x11b,"void ctor_suite::construct_map_key_string()",&data_2.storage.field_0x2d,
             &data_2.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_148);
  data_3.storage._47_1_ = 1;
  auStack_2a8._24_8_ = &local_288;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_308,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_2d8,1);
  auStack_2a8._8_8_ = &local_308;
  auStack_2a8._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_288,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_2a8 + 8));
  data_3.storage._47_1_ = 0;
  local_258._0_8_ = &local_288;
  local_258._8_8_ = 1;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_248,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_258);
  local_9b8 = (basic_variable<std::allocator<char>_> *)local_258;
  do {
    local_9b8 = local_9b8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_9b8);
  } while (local_9b8 != &local_288);
  local_9d0 = (basic_variable<std::allocator<char>_> *)auStack_2a8;
  do {
    local_9d0 = local_9d0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_9d0);
  } while (local_9d0 != &local_308);
  data_3.storage._45_1_ =
       trial::dynamic::basic_variable<std::allocator<char>>::
       is<trial::dynamic::basic_map<std::allocator<char>>>
                 ((basic_variable<std::allocator<char>> *)local_248);
  data_3.storage._44_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<map>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x11f,"void ctor_suite::construct_map_key_string()",&data_3.storage.field_0x2d,
             &data_3.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_248);
  data_4.storage._47_1_ = 1;
  auStack_3a8._24_8_ = &local_388;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_408,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_3d8,1);
  auStack_3a8._8_8_ = &local_408;
  auStack_3a8._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_388,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_3a8 + 8));
  data_4.storage._47_1_ = 0;
  local_358._0_8_ = &local_388;
  local_358._8_8_ = 1;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_348,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_358);
  local_9e8 = (basic_variable<std::allocator<char>_> *)local_358;
  do {
    local_9e8 = local_9e8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_9e8);
  } while (local_9e8 != &local_388);
  local_a00 = (basic_variable<std::allocator<char>_> *)auStack_3a8;
  do {
    local_a00 = local_a00 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_a00);
  } while (local_a00 != &local_408);
  data_4.storage._45_1_ =
       trial::dynamic::basic_variable<std::allocator<char>>::
       is<trial::dynamic::basic_map<std::allocator<char>>>
                 ((basic_variable<std::allocator<char>> *)local_348);
  data_4.storage._44_1_ = 1;
  sVar2 = 0x123;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<map>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x123,"void ctor_suite::construct_map_key_string()",&data_4.storage.field_0x2d,
             &data_4.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_348);
  data_5.storage._44_4_ = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>
            (&local_4b8,(char (*) [6])"alpha",(int *)&data_5.storage.field_0x2c);
  local_458._0_8_ = &local_4b8;
  local_458._8_8_ = 1;
  init._M_len = sVar2;
  init._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)local_448,
             (basic_map<std::allocator<char>_> *)local_458._0_8_,init);
  local_a18 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_458;
  do {
    local_a18 = local_a18 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_a18);
  } while (local_a18 != &local_4b8);
  data_5.storage._42_1_ =
       trial::dynamic::basic_variable<std::allocator<char>>::
       is<trial::dynamic::basic_map<std::allocator<char>>>
                 ((basic_variable<std::allocator<char>> *)local_448);
  data_5.storage._41_1_ = 1;
  sVar2 = 0x127;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<map>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x127,"void ctor_suite::construct_map_key_string()",&data_5.storage.field_0x2a,
             &data_5.storage.field_0x29);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_448);
  data_6.storage._44_4_ = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_wchar_t_(&)[6],_int,_true>
            (&local_568,(wchar_t (*) [6])L"bravo",(int *)&data_6.storage.field_0x2c);
  local_508._0_8_ = &local_568;
  local_508._8_8_ = 1;
  init_00._M_len = sVar2;
  init_00._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)local_4f8,
             (basic_map<std::allocator<char>_> *)local_508._0_8_,init_00);
  local_a30 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_508;
  do {
    local_a30 = local_a30 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_a30);
  } while (local_a30 != &local_568);
  data_6.storage._42_1_ =
       trial::dynamic::basic_variable<std::allocator<char>>::
       is<trial::dynamic::basic_map<std::allocator<char>>>
                 ((basic_variable<std::allocator<char>> *)local_4f8);
  data_6.storage._41_1_ = 1;
  sVar2 = 299;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<map>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,299,"void ctor_suite::construct_map_key_string()",&data_6.storage.field_0x2a,
             &data_6.storage.field_0x29);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_4f8);
  data_7.storage._44_4_ = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char16_t_(&)[8],_int,_true>
            (&local_618,(char16_t (*) [8])L"charlie",(int *)&data_7.storage.field_0x2c);
  local_5b8._0_8_ = &local_618;
  local_5b8._8_8_ = 1;
  init_01._M_len = sVar2;
  init_01._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)local_5a8,
             (basic_map<std::allocator<char>_> *)local_5b8._0_8_,init_01);
  local_a48 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_5b8;
  do {
    local_a48 = local_a48 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_a48);
  } while (local_a48 != &local_618);
  data_7.storage._42_1_ =
       trial::dynamic::basic_variable<std::allocator<char>>::
       is<trial::dynamic::basic_map<std::allocator<char>>>
                 ((basic_variable<std::allocator<char>> *)local_5a8);
  data_7.storage._41_1_ = 1;
  sVar2 = 0x12f;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<map>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x12f,"void ctor_suite::construct_map_key_string()",&data_7.storage.field_0x2a,
             &data_7.storage.field_0x29);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_5a8);
  data_8.storage._44_4_ = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char32_t_(&)[6],_int,_true>
            (&local_6c8,(char32_t (*) [6])L"delta",(int *)&data_8.storage.field_0x2c);
  local_668._0_8_ = &local_6c8;
  local_668._8_8_ = 1;
  init_02._M_len = sVar2;
  init_02._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)local_658,
             (basic_map<std::allocator<char>_> *)local_668._0_8_,init_02);
  local_a60 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_668;
  do {
    local_a60 = local_a60 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_a60);
  } while (local_a60 != &local_6c8);
  data_8.storage._42_1_ =
       trial::dynamic::basic_variable<std::allocator<char>>::
       is<trial::dynamic::basic_map<std::allocator<char>>>
                 ((basic_variable<std::allocator<char>> *)local_658);
  data_8.storage._41_1_ = 1;
  iVar1 = 0x133;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<map>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x133,"void ctor_suite::construct_map_key_string()",&data_8.storage.field_0x2a,
             &data_8.storage.field_0x29);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_658);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_728,"alpha",&local_729);
  trial::dynamic::basic_map<std::allocator<char>>::make<std::__cxx11::string,int>
            ((basic_variable<std::allocator<char>_> *)local_708,
             (basic_map<std::allocator<char>> *)local_728,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1,iVar1);
  std::__cxx11::string::~string(local_728);
  std::allocator<char>::~allocator(&local_729);
  local_72b[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                 is<trial::dynamic::basic_map<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>> *)local_708);
  local_72c = 1;
  iVar1 = 0x137;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<map>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x137,"void ctor_suite::construct_map_key_string()",local_72b,&local_72c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_708);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_788,L"bravo",&local_789);
  trial::dynamic::basic_map<std::allocator<char>>::make<std::__cxx11::wstring,int>
            ((basic_variable<std::allocator<char>_> *)local_768,
             (basic_map<std::allocator<char>> *)local_788,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)0x1,iVar1
            );
  std::__cxx11::wstring::~wstring(local_788);
  std::allocator<wchar_t>::~allocator(&local_789);
  local_78b[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                 is<trial::dynamic::basic_map<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>> *)local_768);
  local_78c = 1;
  iVar1 = 0x13b;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<map>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x13b,"void ctor_suite::construct_map_key_string()",local_78b,&local_78c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_768);
  std::allocator<char16_t>::allocator(&local_7e9);
  std::__cxx11::u16string::u16string<std::allocator<char16_t>>(local_7e8,L"charlie",&local_7e9);
  trial::dynamic::basic_map<std::allocator<char>>::make<std::__cxx11::u16string,int>
            ((basic_variable<std::allocator<char>_> *)local_7c8,
             (basic_map<std::allocator<char>> *)local_7e8,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)0x1,
             iVar1);
  std::__cxx11::u16string::~u16string(local_7e8);
  std::allocator<char16_t>::~allocator(&local_7e9);
  local_7eb[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                 is<trial::dynamic::basic_map<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>> *)local_7c8);
  local_7ec = 1;
  iVar1 = 0x13f;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<map>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x13f,"void ctor_suite::construct_map_key_string()",local_7eb,&local_7ec);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_7c8);
  std::allocator<char32_t>::allocator(&local_849);
  std::__cxx11::u32string::u32string<std::allocator<char32_t>>(local_848,L"delta",&local_849);
  trial::dynamic::basic_map<std::allocator<char>>::make<std::__cxx11::u32string,int>
            ((basic_variable<std::allocator<char>_> *)local_828,
             (basic_map<std::allocator<char>> *)local_848,
             (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)0x1,
             iVar1);
  std::__cxx11::u32string::~u32string(local_848);
  std::allocator<char32_t>::~allocator(&local_849);
  local_84b[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                 is<trial::dynamic::basic_map<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>> *)local_828);
  local_84c = 1;
  iVar1 = 0x143;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<map>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x143,"void ctor_suite::construct_map_key_string()",local_84b,&local_84c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_828);
  trial::dynamic::basic_map<std::allocator<char>>::make<char_const*,int>
            ((basic_variable<std::allocator<char>_> *)local_888,
             (basic_map<std::allocator<char>> *)"alpha",(char *)0x1,iVar1);
  local_88a[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                 is<trial::dynamic::basic_map<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>> *)local_888);
  local_88b = 1;
  iVar1 = 0x147;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<map>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x147,"void ctor_suite::construct_map_key_string()",local_88a,&local_88b);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_888);
  trial::dynamic::basic_map<std::allocator<char>>::make<wchar_t_const*,int>
            ((basic_variable<std::allocator<char>_> *)local_8c8,
             (basic_map<std::allocator<char>> *)L"bravo",(wchar_t *)0x1,iVar1);
  local_8ca[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                 is<trial::dynamic::basic_map<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>> *)local_8c8);
  local_8cb = 1;
  iVar1 = 0x14b;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<map>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x14b,"void ctor_suite::construct_map_key_string()",local_8ca,&local_8cb);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_8c8);
  trial::dynamic::basic_map<std::allocator<char>>::make<char16_t_const*,int>
            ((basic_variable<std::allocator<char>_> *)local_908,
             (basic_map<std::allocator<char>> *)L"charlie",(char16_t *)0x1,iVar1);
  local_90a[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                 is<trial::dynamic::basic_map<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>> *)local_908);
  local_90b = 1;
  iVar1 = 0x14f;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<map>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x14f,"void ctor_suite::construct_map_key_string()",local_90a,&local_90b);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_908);
  trial::dynamic::basic_map<std::allocator<char>>::make<char32_t_const*,int>
            ((basic_variable<std::allocator<char>_> *)local_948,
             (basic_map<std::allocator<char>> *)L"delta",(char32_t *)0x1,iVar1);
  local_94a[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                 is<trial::dynamic::basic_map<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>> *)local_948);
  local_94b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<map>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x153,"void ctor_suite::construct_map_key_string()",local_94a,&local_94b);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_948);
  return;
}

Assistant:

void construct_map_key_string()
{
    {
        variable data({ {"alpha", 1} });
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<map>(), true);
    }
    {
        variable data({ {L"bravo", 1} });
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<map>(), true);
    }
    {
        variable data({ {u"charlie", 1} });
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<map>(), true);
    }
    {
        variable data({ {U"delta", 1} });
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<map>(), true);
    }
    {
        variable data(map::make({ {"alpha", 1} }));
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<map>(), true);
    }
    {
        variable data(map::make({ {L"bravo", 1} }));
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<map>(), true);
    }
    {
        variable data(map::make({ {u"charlie", 1} }));
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<map>(), true);
    }
    {
        variable data(map::make({ {U"delta", 1} }));
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<map>(), true);
    }
    {
        variable data(map::make(std::string("alpha"), 1));
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<map>(), true);
    }
    {
        variable data(map::make(std::wstring(L"bravo"), 1));
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<map>(), true);
    }
    {
        variable data(map::make(std::u16string(u"charlie"), 1));
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<map>(), true);
    }
    {
        variable data(map::make(std::u32string(U"delta"), 1));
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<map>(), true);
    }
    {
        variable data(map::make("alpha", 1));
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<map>(), true);
    }
    {
        variable data(map::make(L"bravo", 1));
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<map>(), true);
    }
    {
        variable data(map::make(u"charlie", 1));
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<map>(), true);
    }
    {
        variable data(map::make(U"delta", 1));
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<map>(), true);
    }
}